

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

int __thiscall Matrix::copy(Matrix *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  shared_count sVar2;
  int iVar3;
  double *__tmp;
  ulong uVar4;
  ulong *puVar5;
  int *piVar6;
  shared_array<double> *psVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  Physical *pPVar12;
  ulong uVar13;
  long lVar14;
  shared_count sStack_d0;
  Physical local_c8;
  
  std::__cxx11::string::_M_assign((string *)&this->sMatrixName);
  this->nMatrixDimension = *(int *)(dst + 0xd8);
  this->nData = *(int *)(dst + 0xb8);
  this->bReference = (bool)((byte)src ^ 1);
  std::__cxx11::string::_M_assign((string *)&(this->super_Physical).physicalDescription);
  std::__cxx11::string::_M_assign((string *)&this->sMatrixName);
  Unit::operator=(&(this->super_Physical).physicalUnit,(Unit *)(dst + 0x30));
  uVar11 = (ulong)this->nMatrixDimension;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar11;
  uVar4 = SUB168(auVar1 * ZEXT816(0x98),0);
  uVar13 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar13 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x98),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar13);
  *puVar5 = uVar11;
  if (uVar11 != 0) {
    lVar9 = 0;
    pPVar12 = (Physical *)(puVar5 + 1);
    do {
      Physical::Physical(pPVar12);
      lVar9 = lVar9 + -0x98;
      pPVar12 = pPVar12 + 1;
    } while (uVar11 * -0x98 - lVar9 != 0);
  }
  this->pPhysicals = (Physical *)(puVar5 + 1);
  iVar3 = this->nMatrixDimension;
  if (0 < iVar3) {
    lVar9 = 0x30;
    lVar14 = 0;
    do {
      Physical::Physical(&local_c8,(Physical *)(*(long *)(dst + 0xd0) + lVar9 + -0x30));
      pPVar12 = this->pPhysicals;
      std::__cxx11::string::_M_assign
                ((string *)((long)(pPVar12->physicalUnit).siUnits + lVar9 + -0x5c));
      *(double *)((long)(pPVar12->physicalUnit).siUnits + lVar9 + -0x3c) = local_c8.dQuantity;
      Unit::operator=((Unit *)((long)(pPVar12->physicalUnit).siUnits + lVar9 + -0x34),
                      &local_c8.physicalUnit);
      Physical::~Physical(&local_c8);
      lVar14 = lVar14 + 1;
      iVar3 = this->nMatrixDimension;
      lVar9 = lVar9 + 0x98;
    } while (lVar14 < iVar3);
  }
  uVar4 = (long)iVar3 * 4;
  if (iVar3 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar4);
  this->pSize = piVar6;
  iVar3 = this->nMatrixDimension;
  lVar9 = (long)iVar3;
  if (0 < lVar9) {
    lVar14 = *(long *)(dst + 0xc0);
    lVar10 = 0;
    do {
      piVar6[lVar10] = *(int *)(lVar14 + lVar10 * 4);
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  uVar4 = lVar9 << 2;
  if (iVar3 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar4);
  this->pMult = piVar6;
  iVar3 = this->nMatrixDimension;
  if (0 < (long)iVar3) {
    lVar9 = *(long *)(dst + 200);
    lVar14 = 0;
    do {
      piVar6[lVar14] = *(int *)(lVar9 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (iVar3 != lVar14);
  }
  if (this->bReference == false) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)this->nData) {
      uVar4 = (long)this->nData * 8;
    }
    pdVar8 = (double *)operator_new__(uVar4);
    this->pData = pdVar8;
    boost::detail::shared_count::shared_count<double*,MatrixDataDeleter>
              (&sStack_d0,pdVar8,(MatrixDataDeleter)0x0);
    sVar2.pi_ = sStack_d0.pi_;
    sStack_d0.pi_ = (sp_counted_base *)0x0;
    local_c8._vptr_Physical = (_func_int **)(this->matrixParent).px;
    (this->matrixParent).px = pdVar8;
    local_c8.physicalDescription._M_dataplus._M_p = (pointer)(this->matrixParent).pn.pi_;
    (this->matrixParent).pn.pi_ = sVar2.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)&local_c8.physicalDescription);
    boost::detail::shared_count::~shared_count(&sStack_d0);
    iVar3 = this->nData;
    if (0 < (long)iVar3) {
      lVar9 = *(long *)(dst + 0xa0);
      pdVar8 = this->pData;
      lVar14 = 0;
      do {
        pdVar8[lVar14] = *(double *)(lVar9 + lVar14 * 8);
        lVar14 = lVar14 + 1;
      } while (iVar3 != lVar14);
    }
  }
  else {
    this->pData = *(double **)(dst + 0xa0);
    psVar7 = boost::shared_array<double>::operator=
                       (&this->matrixParent,(shared_array<double> *)(dst + 0xa8));
    iVar3 = (int)psVar7;
  }
  return iVar3;
}

Assistant:

void Matrix::copy( const Matrix &m, bool deep )
{
	// copy main variables
	sMatrixName = m.sMatrixName;
	nMatrixDimension = m.nMatrixDimension;
	nData = m.nData;
	bReference = deep ? false : true;
	physicalDescription = m.physicalDescription;
	sMatrixName = m.sMatrixName;
	physicalUnit = m.physicalUnit;
	
	pPhysicals = new Physical[nMatrixDimension]();
	for( int i=0; i<nMatrixDimension; i++)
		pPhysicals[i] = Physical(m.pPhysicals[i]);

	pSize = new int[nMatrixDimension];
	for( int i=0; i<nMatrixDimension; i++ )
		pSize[i] = m.pSize[i];

	pMult = new int[nMatrixDimension];
	for( int i=0; i<nMatrixDimension; i++ )
		pMult[i] = m.pMult[i];		

	// copy all content if deep copy is wanted
	if( !bReference ) {
		pData = new double[nData];
		matrixParent =  shared_array<double>(pData, MatrixDataDeleter(this));
		for( int i=0; i<nData; i++ )
			pData[i] = m.pData[i];
	}
	// else copy only pointers
	else {
		pData = m.pData;
		matrixParent = m.matrixParent;
	}
}